

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_artifacts(void)

{
  uint16_t v;
  artifact_upkeep *paVar1;
  artifact_upkeep *au;
  uint16_t tmp16u;
  wchar_t i;
  
  v = z_info->a_max;
  wr_u16b(v);
  for (au._4_4_ = 0; paVar1 = aup_info, au._4_4_ < (int)(uint)v; au._4_4_ = au._4_4_ + 1) {
    wr_byte((aup_info[au._4_4_].created & 1U) != 0);
    wr_byte((paVar1[au._4_4_].seen & 1U) != 0);
    wr_byte((paVar1[au._4_4_].everseen & 1U) != 0);
    wr_byte('\0');
  }
  return;
}

Assistant:

void wr_artifacts(void)
{
	int i;
	uint16_t tmp16u;

	/* Hack -- Dump the artifacts */
	tmp16u = z_info->a_max;
	wr_u16b(tmp16u);
	for (i = 0; i < tmp16u; i++) {
		const struct artifact_upkeep *au = &aup_info[i];
		wr_byte(au->created ? 1 : 0);
		wr_byte(au->seen ? 1 : 0);
		wr_byte(au->everseen ? 1 : 0);
		wr_byte(0);
	}
}